

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O1

Float __thiscall pbrt::PortalImageInfiniteLight::Area(PortalImageInfiniteLight *this)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  fVar1 = (this->portal).values[1].super_Tuple3<pbrt::Point3,_float>.y -
          (this->portal).values[0].super_Tuple3<pbrt::Point3,_float>.y;
  auVar4 = ZEXT416((uint)((this->portal).values[1].super_Tuple3<pbrt::Point3,_float>.x -
                         (this->portal).values[0].super_Tuple3<pbrt::Point3,_float>.x));
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar1)),auVar4,auVar4);
  auVar3 = ZEXT416((uint)((this->portal).values[1].super_Tuple3<pbrt::Point3,_float>.z -
                         (this->portal).values[0].super_Tuple3<pbrt::Point3,_float>.z));
  auVar4 = vfmadd231ss_fma(auVar4,auVar3,auVar3);
  if (auVar4._0_4_ < 0.0) {
    fVar1 = sqrtf(auVar4._0_4_);
  }
  else {
    auVar4 = vsqrtss_avx(auVar4,auVar4);
    fVar1 = auVar4._0_4_;
  }
  fVar2 = (this->portal).values[3].super_Tuple3<pbrt::Point3,_float>.y -
          (this->portal).values[0].super_Tuple3<pbrt::Point3,_float>.y;
  auVar4 = ZEXT416((uint)((this->portal).values[3].super_Tuple3<pbrt::Point3,_float>.x -
                         (this->portal).values[0].super_Tuple3<pbrt::Point3,_float>.x));
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar2)),auVar4,auVar4);
  auVar3 = ZEXT416((uint)((this->portal).values[3].super_Tuple3<pbrt::Point3,_float>.z -
                         (this->portal).values[0].super_Tuple3<pbrt::Point3,_float>.z));
  auVar4 = vfmadd231ss_fma(auVar4,auVar3,auVar3);
  if (auVar4._0_4_ < 0.0) {
    fVar2 = sqrtf(auVar4._0_4_);
  }
  else {
    auVar4 = vsqrtss_avx(auVar4,auVar4);
    fVar2 = auVar4._0_4_;
  }
  return fVar1 * fVar2;
}

Assistant:

PBRT_CPU_GPU
    Float Area() const {
        return Length(portal[1] - portal[0]) * Length(portal[3] - portal[0]);
    }